

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

string cs::get_import_path_abi_cxx11_(void)

{
  proxy *in_RDI;
  string base_path;
  char *import_path;
  any *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  any *in_stack_fffffffffffffe68;
  allocator *__lhs;
  allocator local_169;
  string local_168 [32];
  string *in_stack_fffffffffffffeb8;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             getenv("CS_IMPORT_PATH");
  get_sdk_path_abi_cxx11_();
  std::operator+(in_stack_fffffffffffffe68,(char)((ulong)in_stack_fffffffffffffe60 >> 0x38));
  std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"/usr/share/covscript",&local_101);
  std::operator+((char)((ulong)in_stack_fffffffffffffe68 >> 0x38),in_stack_fffffffffffffe60);
  std::operator+(in_stack_fffffffffffffe68,(char)((ulong)in_stack_fffffffffffffe60 >> 0x38));
  std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
  std::__cxx11::string::operator+=(local_30,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    process_path(in_stack_fffffffffffffeb8);
  }
  else {
    __lhs = &local_169;
    __rhs = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,(char *)__rhs,__lhs);
    std::operator+((any *)__lhs,(char)((ulong)__rhs >> 0x38));
    std::operator+((any *)__lhs,__rhs);
    process_path(in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  std::__cxx11::string::~string(local_30);
  return (string)in_RDI;
}

Assistant:

std::string get_import_path()
	{
		const char *import_path = std::getenv("CS_IMPORT_PATH");
		std::string base_path = get_sdk_path() + cs::path_separator + "imports";
		base_path += cs::path_delimiter + std::string(COVSCRIPT_PLATFORM_HOME) + cs::path_separator + "imports";
		if (import_path != nullptr)
			return process_path(std::string(import_path) + cs::path_delimiter + base_path);
		else
			return process_path(base_path);
	}